

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

int __thiscall
TadsHttpServerThread::read_to_nl
          (TadsHttpServerThread *this,StringRef *dst,long ofs,int init_state,int end_state)

{
  char cVar1;
  int iVar2;
  ssize_t l;
  uint uVar3;
  char buf [8192];
  char local_2038 [8200];
  
  do {
    if ((ofs < dst->len) && (init_state != end_state)) {
      uVar3 = init_state;
      do {
        if ((uVar3 != 2) || (init_state = 3, dst->str[ofs] != '\r')) {
          cVar1 = dst->str[ofs];
          init_state = 1;
          if (cVar1 != '\r') {
            init_state = uVar3 + 1;
            if (cVar1 != '\n') {
              init_state = 0;
            }
            if ((uVar3 & 0xfffffffd) != 1) {
              init_state = 0;
            }
          }
        }
        ofs = ofs + 1;
      } while ((ofs < dst->len) && (uVar3 = init_state, init_state != end_state));
    }
    iVar2 = 2;
    if (init_state != end_state) {
      l = TadsServerThread::read(&this->super_TadsServerThread,(int)local_2038,(void *)0x2000,1);
      TadsServerThread::set_run_state(&this->super_TadsServerThread,"Processing request");
      if (l < 0) {
        iVar2 = 1;
      }
      else {
        StringRef::append(dst,local_2038,l);
        iVar2 = 0;
      }
    }
  } while (iVar2 == 0);
  if (iVar2 != 2) {
    ofs = 0xffffffff;
  }
  return (int)ofs;
}

Assistant:

int TadsHttpServerThread::read_to_nl(StringRef *dst, long ofs,
                                     int init_state, int end_state)
{
    /* newline state: 0 \r -> 1 \n -> 2 \r -> 3 \n -> 4 */
    int nlstate = init_state;

    /* keep going until we find the newline or newline pair */
    for (;;)
    {
        char buf[8192];

        /* scan up to the ending offset */
        const char *p = dst->get() + ofs;
        long endofs = dst->getlen();
        for ( ; ofs < endofs && nlstate != end_state ; ++ofs, ++p)
        {
            if (nlstate == 2 && *p == '\r')
                nlstate = 3;
            else if (*p == '\r')
                nlstate = 1;
            else if ((nlstate == 1 || nlstate == 3) && *p == '\n')
                nlstate += 1;
            else
                nlstate = 0;
        }

        /* if we're in the end state, we're done */
        if (nlstate == end_state)
            break;

        /* 
         *   We didn't find the end sequence, so we need more input.  Read at
         *   least one byte with no timeout, so that we block until
         *   something's available and then read all available bytes.  
         */
        long len = read(buf, sizeof(buf), 1, OS_FOREVER);
        set_run_state("Processing request");

        /* if we got the 'quit' signal, stop now */
        if (len < 0)
            return -1;

        /* append the text to the buffer */
        dst->append(buf, len);
    }

    /* return the buffer offset of the end of the terminating newline */
    return ofs;
}